

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readdata.cpp
# Opt level: O0

int __thiscall ReadData::ReadRefPos(ReadData *this,FILE *file,uchar *HeadBuff)

{
  int MessageLength;
  code *pcVar1;
  bool bVar2;
  uchar *Message;
  size_t sVar3;
  ulong uVar4;
  double dVar5;
  char *buff;
  uchar *HeadBuff_local;
  FILE *file_local;
  ReadData *this_local;
  
  if ((this->Head).MessageID == 0x2f) {
    uVar4 = (ulong)((this->Head).MessageLength + 4);
    if ((long)uVar4 < 0) {
      uVar4 = 0xffffffffffffffff;
    }
    Message = (uchar *)operator_new__(uVar4);
    sVar3 = fread(Message,(long)((this->Head).MessageLength + 4),1,(FILE *)file);
    if (sVar3 == 0) {
      this_local._4_4_ = 2;
    }
    else {
      MessageLength = (this->Head).MessageLength;
      bVar2 = CRCCheck(HeadBuff,Message,MessageLength,MessageLength);
      if (bVar2) {
        dVar5 = C2D((char *)(Message + 8),8);
        (this->UserPsrPos).B = dVar5;
        dVar5 = C2D((char *)(Message + 0x10),8);
        (this->UserPsrPos).L = dVar5;
        dVar5 = C2D((char *)(Message + 0x18),8);
        (this->UserPsrPos).H = dVar5;
        if (Message != (uchar *)0x0) {
          operator_delete__(Message);
        }
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      this_local._4_4_ = 3;
    }
  }
  else {
    this_local._4_4_ = 6;
  }
  return this_local._4_4_;
}

Assistant:

int ReadData::ReadRefPos(FILE* file, unsigned char* HeadBuff) {
    if(Head.MessageID != 47)
        return CONFLICT_ID;
    
    char* buff = new char[Head.MessageLength + 4];
    if(!fread(buff, this->Head.MessageLength + 4, 1, file))
        return FILE_OR_BUFF_END;

    try {
        if(!CRCCheck(HeadBuff, (unsigned char*)buff, Head.MessageLength, Head.MessageLength))
            return CRC_FAILED;
        UserPsrPos.B = C2D(buff + 8, 8);
        UserPsrPos.L = C2D(buff + 16, 8);
        UserPsrPos.H = C2D(buff + 24, 8);
    } 
    catch(...) {
        cout << "error happened when reading GPS ehpe" << endl;
        return UNKNOWN_ERROR;
    }
    
    delete [] buff;
   
}